

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O2

int archive_write_set_format_pax(archive *_a)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_format_pax");
  iVar3 = -0x1e;
  if (iVar1 != -0x1e) {
    if (*(code **)(_a + 2) != (code *)0x0) {
      (**(code **)(_a + 2))(_a);
    }
    pvVar2 = calloc(1,0x80);
    if (pvVar2 == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate pax data");
    }
    else {
      *(undefined4 *)((long)pvVar2 + 0x7c) = 3;
      *(void **)&_a[1].current_codepage = pvVar2;
      _a[1].sconv = (archive_string_conv *)0x483968;
      _a[1].read_data_offset = (int64_t)archive_write_pax_options;
      _a[1].read_data_remaining = (size_t)archive_write_pax_header;
      *(code **)&_a[1].read_data_is_posix_read = archive_write_pax_data;
      _a[1].read_data_requested = (size_t)archive_write_pax_close;
      *(code **)(_a + 2) = archive_write_pax_free;
      _a[1].read_data_output_offset = (int64_t)archive_write_pax_finish_entry;
      _a->archive_format = 0x30002;
      _a->archive_format_name = "POSIX pax interchange";
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
archive_write_set_format_pax(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct pax *pax;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_pax");

	if (a->format_free != NULL)
		(a->format_free)(a);

	pax = (struct pax *)calloc(1, sizeof(*pax));
	if (pax == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate pax data");
		return (ARCHIVE_FATAL);
	}
	pax->flags = WRITE_LIBARCHIVE_XATTR | WRITE_SCHILY_XATTR;

	a->format_data = pax;
	a->format_name = "pax";
	a->format_options = archive_write_pax_options;
	a->format_write_header = archive_write_pax_header;
	a->format_write_data = archive_write_pax_data;
	a->format_close = archive_write_pax_close;
	a->format_free = archive_write_pax_free;
	a->format_finish_entry = archive_write_pax_finish_entry;
	a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
	a->archive.archive_format_name = "POSIX pax interchange";
	return (ARCHIVE_OK);
}